

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.h
# Opt level: O0

vm_obj_id_t __thiscall
CVmObjClass::find_intcls_for_mod(CVmObjClass *this,vm_obj_id_t self,vm_obj_id_t mod_obj)

{
  vm_obj_id_t vVar1;
  vm_obj_id_t in_EDX;
  vm_obj_id_t in_ESI;
  CVmObjClass *in_RDI;
  
  vVar1 = find_mod_src_obj(in_RDI,in_ESI,in_EDX);
  return vVar1;
}

Assistant:

vm_obj_id_t find_intcls_for_mod(VMG_ vm_obj_id_t self,
                                    vm_obj_id_t mod_obj)
    {
        /*
         *   The implementation is very simple: just look for a modifier
         *   object attached to this object or one of its intrinsic
         *   superclasses.  The difference between this and the regular
         *   CVmObject implementation is that the CVmObject implementation
         *   looks in the object's metaclass; we simply look in our intrinsic
         *   superclasses directly, since, for reflection purposes, we are
         *   our own metaclass.  
         */
        return find_mod_src_obj(vmg_ self, mod_obj);
    }